

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void restore_dungeon(memfile *mf)

{
  branch *pbVar1;
  int32_t iVar2;
  branch *b;
  int local_28;
  int i;
  int count;
  branch *last;
  branch *curr;
  memfile *mf_local;
  
  mfmagic_check(mf,0x4e4744);
  mread(mf,&n_dgns,4);
  for (local_28 = 0; local_28 < n_dgns; local_28 = local_28 + 1) {
    restore_dungeon_struct(mf,dungeons + local_28);
  }
  mread(mf,&dungeon_topology,0x3e);
  mread(mf,tune,6);
  branches = (branch *)0x0;
  _i = (branch *)0x0;
  iVar2 = mread32(mf);
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    b = (branch *)malloc(0x18);
    restore_branch(mf,b);
    pbVar1 = b;
    if (_i != (branch *)0x0) {
      _i->next = b;
      pbVar1 = branches;
    }
    branches = pbVar1;
    _i = b;
  }
  mread(mf,&inv_pos,2);
  return;
}

Assistant:

void restore_dungeon(struct memfile *mf)
{
    branch *curr, *last;
    int    count, i;

    mfmagic_check(mf, DGN_MAGIC);
    mread(mf, &n_dgns, sizeof(n_dgns));
    for (i = 0; i < n_dgns; i++)
	restore_dungeon_struct(mf, &dungeons[i]);
    mread(mf, &dungeon_topology, sizeof dungeon_topology);
    mread(mf, tune, sizeof tune);

    last = branches = NULL;

    count = mread32(mf);
    for (i = 0; i < count; i++) {
	curr = malloc(sizeof(branch));
	restore_branch(mf, curr);
	if (last)
	    last->next = curr;
	else
	    branches = curr;
	last = curr;
    }

    mread(mf, &inv_pos, sizeof(coord));
}